

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

Span<char> __thiscall Potassco::StringBuilder::toSpan(StringBuilder *this)

{
  Span<char> SVar1;
  StringBuilder *unaff_retaddr;
  Buffer x;
  undefined8 local_30;
  undefined8 local_28;
  
  buffer(unaff_retaddr);
  SVar1 = toSpan<char>(local_30,local_28);
  return SVar1;
}

Assistant:

Span<char> StringBuilder::toSpan() const {
	Buffer x = buffer();
	return Potassco::toSpan(x.head, x.used);
}